

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O2

Token front::word::get_token(string *buf)

{
  bool bVar1;
  Token TVar2;
  
  bVar1 = std::operator==(buf,"const");
  if (bVar1) {
    TVar2 = CONSTTK;
  }
  else {
    bVar1 = std::operator==(buf,"int");
    if (bVar1) {
      TVar2 = INTTK;
    }
    else {
      bVar1 = std::operator==(buf,"void");
      if (bVar1) {
        TVar2 = VOIDTK;
      }
      else {
        bVar1 = std::operator==(buf,"if");
        if (bVar1) {
          TVar2 = IFTK;
        }
        else {
          bVar1 = std::operator==(buf,"else");
          if (bVar1) {
            TVar2 = ELSETK;
          }
          else {
            bVar1 = std::operator==(buf,"while");
            if (bVar1) {
              TVar2 = WHILETK;
            }
            else {
              bVar1 = std::operator==(buf,"break");
              if (bVar1) {
                TVar2 = BREAK;
              }
              else {
                bVar1 = std::operator==(buf,"continue");
                if (bVar1) {
                  TVar2 = CONTINUETK;
                }
                else {
                  bVar1 = std::operator==(buf,"return");
                  TVar2 = RETURNTK;
                  if (!bVar1) {
                    TVar2 = IDENFR;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Token front::word::get_token(const string &buf) {
  if (buf == "const") {
    return Token::CONSTTK;
  } else if (buf == "int") {
    return Token::INTTK;
  } else if (buf == "void") {
    return Token::VOIDTK;
  } else if (buf == "if") {
    return Token::IFTK;
  } else if (buf == "else") {
    return Token::ELSETK;
  } else if (buf == "while") {
    return Token::WHILETK;
  } else if (buf == "break") {
    return Token::BREAK;
  } else if (buf == "continue") {
    return Token::CONTINUETK;
  } else if (buf == "return") {
    return Token::RETURNTK;
  } else {
    return Token::IDENFR;
  }
}